

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

void REVassoc_bridge_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVaction EVar1;
  CMFormat format;
  attr_list contact_list;
  EV_int_response response;
  undefined4 local_38;
  EVaction local_34;
  
  format = CMlookup_format(conn->cm,EV_int_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_int_response_formats);
  }
  contact_list = (attr_list)attr_list_from_string(*(undefined8 *)((long)data + 8));
  EVar1 = EVassoc_bridge_action
                    (cm,*(EVstone *)((long)data + 4),contact_list,*(EVstone *)((long)data + 0x10));
  free_attr_list(contact_list);
  _local_38 = CONCAT44(EVar1,*data);
  CMwrite(conn,format,&local_38);
  return;
}

Assistant:

static void
REVassoc_bridge_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVassoc_bridge_action_request *request = (EVassoc_bridge_action_request *) data;
    EVaction ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    attr_list contact_list = attr_list_from_string(request->contact_list);
    ret = EVassoc_bridge_action(cm, request->stone, contact_list, request->remote_stone);
free_attr_list(contact_list);
    response.ret = (int) ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}